

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

string * __thiscall
FIX::Message::toString
          (Message *this,string *str,int beginStringField,int bodyLengthField,int checkSumField)

{
  int field;
  int data;
  FieldBase local_f8;
  FieldBase local_88;
  int local_28;
  int local_24;
  int length;
  int checkSumField_local;
  int bodyLengthField_local;
  int beginStringField_local;
  string *str_local;
  Message *this_local;
  
  local_24 = checkSumField;
  length = bodyLengthField;
  checkSumField_local = beginStringField;
  _bodyLengthField_local = str;
  str_local = (string *)this;
  local_28 = bodyLength(this,beginStringField,bodyLengthField,checkSumField);
  IntField::IntField((IntField *)&local_88,length,local_28);
  FieldMap::setField(&(this->m_header).super_FieldMap,&local_88,true);
  IntField::~IntField((IntField *)&local_88);
  field = local_24;
  data = checkSum(this,local_24);
  CheckSumField::CheckSumField((CheckSumField *)&local_f8,field,data);
  FieldMap::setField(&(this->m_trailer).super_FieldMap,&local_f8,true);
  CheckSumField::~CheckSumField((CheckSumField *)&local_f8);
  std::__cxx11::string::clear();
  std::__cxx11::string::reserve((ulong)_bodyLengthField_local);
  FieldMap::calculateString(&(this->m_header).super_FieldMap,_bodyLengthField_local);
  FieldMap::calculateString(&this->super_FieldMap,_bodyLengthField_local);
  FieldMap::calculateString(&(this->m_trailer).super_FieldMap,_bodyLengthField_local);
  return _bodyLengthField_local;
}

Assistant:

std::string& Message::toString( std::string& str, 
                                int beginStringField,
                                int bodyLengthField, 
                                int checkSumField ) const
{
  int length = bodyLength( beginStringField, bodyLengthField, checkSumField );
  m_header.setField( IntField(bodyLengthField, length) );
  m_trailer.setField( CheckSumField(checkSumField, checkSum(checkSumField)) );

#if defined(_MSC_VER) && _MSC_VER < 1300
  str = "";
#else
  str.clear();
#endif

  /*small speculation about the space needed for FIX string*/
  str.reserve( length + 64 );

  m_header.calculateString( str );
  FieldMap::calculateString( str );
  m_trailer.calculateString( str );

  return str;
}